

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O2

unique_ptr<charls::decoder_strategy,_std::default_delete<charls::decoder_strategy>_> __thiscall
charls::jls_codec_factory<charls::decoder_strategy>::create_codec
          (jls_codec_factory<charls::decoder_strategy> *this,frame_info *frame,
          coding_parameters *parameters,jpegls_pc_parameters *preset_coding_parameters)

{
  interleave_mode bits_per_sample;
  int32_t iVar1;
  int32_t *in_R8;
  _Head_base<0UL,_charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>_*,_false>
  _Var2;
  default_traits<unsigned_char,_unsigned_char> traits;
  undefined1 local_50 [8];
  default_traits<unsigned_char,_unsigned_char> local_48;
  
  *(undefined8 *)this = 0;
  if (in_R8[4] == 0x40) {
    try_create_optimized_codec
              ((jls_codec_factory<charls::decoder_strategy> *)(local_50 + 8),frame,parameters);
    _Var2._M_head_impl =
         (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>
          *)CONCAT44(local_48.near_lossless,local_48.maximum_sample_value);
    *(jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy> **)
     this = _Var2._M_head_impl;
    if (_Var2._M_head_impl !=
        (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy> *
        )0x0) goto LAB_0010d5d3;
  }
  bits_per_sample = parameters->interleave_mode;
  if ((int)bits_per_sample < 9) {
    iVar1 = calculate_maximum_sample_value(bits_per_sample);
    default_traits<unsigned_char,_unsigned_char>::default_traits
              ((default_traits<unsigned_char,_unsigned_char> *)(local_50 + 8),iVar1,
               preset_coding_parameters->maximum_sample_value,in_R8[4]);
    local_48.maximum_sample_value = *in_R8;
    std::
    make_unique<charls::jls_codec<charls::default_traits<unsigned_char,unsigned_char>,charls::decoder_strategy>,charls::default_traits<unsigned_char,unsigned_char>&,charls_frame_info_const&,charls::coding_parameters_const&>
              ((default_traits<unsigned_char,_unsigned_char> *)local_50,
               (charls_frame_info *)(local_50 + 8),parameters);
    _Var2._M_head_impl =
         (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>
          *)local_50;
    local_50 = (undefined1  [8])0x0;
    *(jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy> **)
     this = _Var2._M_head_impl;
    std::
    unique_ptr<charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>,_std::default_delete<charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>_>_>
    ::~unique_ptr((unique_ptr<charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>,_std::default_delete<charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>_>_>
                   *)local_50);
  }
  else {
    iVar1 = calculate_maximum_sample_value(bits_per_sample);
    default_traits<unsigned_short,_unsigned_short>::default_traits
              ((default_traits<unsigned_short,_unsigned_short> *)(local_50 + 8),iVar1,
               preset_coding_parameters->maximum_sample_value,in_R8[4]);
    local_48.maximum_sample_value = *in_R8;
    std::
    make_unique<charls::jls_codec<charls::default_traits<unsigned_short,unsigned_short>,charls::decoder_strategy>,charls::default_traits<unsigned_short,unsigned_short>&,charls_frame_info_const&,charls::coding_parameters_const&>
              ((default_traits<unsigned_short,_unsigned_short> *)local_50,
               (charls_frame_info *)(local_50 + 8),parameters);
    _Var2._M_head_impl =
         (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>
          *)local_50;
    local_50 = (undefined1  [8])0x0;
    *(jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy> **)
     this = _Var2._M_head_impl;
    std::
    unique_ptr<charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>,_std::default_delete<charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>_>_>
    ::~unique_ptr((unique_ptr<charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>,_std::default_delete<charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>_>_>
                   *)local_50);
  }
LAB_0010d5d3:
  (*((_Var2._M_head_impl)->super_decoder_strategy)._vptr_decoder_strategy[3])(_Var2._M_head_impl);
  return (__uniq_ptr_data<charls::decoder_strategy,_std::default_delete<charls::decoder_strategy>,_true,_true>
          )(__uniq_ptr_data<charls::decoder_strategy,_std::default_delete<charls::decoder_strategy>,_true,_true>
            )this;
}

Assistant:

unique_ptr<Strategy> jls_codec_factory<Strategy>::create_codec(const frame_info& frame, const coding_parameters& parameters,
                                                               const jpegls_pc_parameters& preset_coding_parameters)
{
    unique_ptr<Strategy> codec;

    if (preset_coding_parameters.reset_value == default_reset_value)
    {
        codec = try_create_optimized_codec(frame, parameters);
    }

    if (!codec)
    {
        if (frame.bits_per_sample <= 8)
        {
            default_traits<uint8_t, uint8_t> traits(calculate_maximum_sample_value(frame.bits_per_sample),
                                                    parameters.near_lossless, preset_coding_parameters.reset_value);
            traits.maximum_sample_value = preset_coding_parameters.maximum_sample_value;
            codec = make_unique<jls_codec<default_traits<uint8_t, uint8_t>, Strategy>>(traits, frame, parameters);
        }
        else
        {
            default_traits<uint16_t, uint16_t> traits(calculate_maximum_sample_value(frame.bits_per_sample),
                                                      parameters.near_lossless, preset_coding_parameters.reset_value);
            traits.maximum_sample_value = preset_coding_parameters.maximum_sample_value;
            codec = make_unique<jls_codec<default_traits<uint16_t, uint16_t>, Strategy>>(traits, frame, parameters);
        }
    }

    codec->set_presets(preset_coding_parameters, parameters.restart_interval);
    return codec;
}